

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void __thiscall google::protobuf::CEscapeAndAppend(protobuf *this,StringPiece src,string *dest)

{
  byte bVar1;
  long *plVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  byte *pbVar6;
  StringPiece local_50;
  StringPiece local_40;
  
  plVar2 = (long *)src.length_;
  pcVar3 = src.ptr_;
  local_50.ptr_ = (char *)this;
  local_50.length_ = (stringpiece_ssize_type)pcVar3;
  local_40.ptr_ = (char *)this;
  local_40.length_ = (stringpiece_ssize_type)pcVar3;
  if ((long)pcVar3 < 1) {
    pcVar4 = (char *)0x0;
  }
  else {
    lVar5 = 0;
    pcVar4 = (char *)0x0;
    do {
      bVar1 = StringPiece::operator[](&local_40,lVar5);
      pcVar4 = pcVar4 + (char)CEscapedLength(google::protobuf::StringPiece)::c_escaped_len[bVar1];
      lVar5 = lVar5 + 1;
    } while (lVar5 < local_40.length_);
  }
  if (pcVar4 == pcVar3) {
    std::__cxx11::string::append((char *)plVar2,(ulong)this);
  }
  else {
    lVar5 = plVar2[1];
    std::__cxx11::string::resize((ulong)plVar2,(char)pcVar4 + (char)lVar5);
    if (0 < (long)pcVar3) {
      pbVar6 = (byte *)(lVar5 + *plVar2);
      lVar5 = 0;
      do {
        bVar1 = StringPiece::operator[](&local_50,lVar5);
        if (bVar1 < 0x22) {
          if (bVar1 == 9) {
            pbVar6[0] = 0x5c;
            pbVar6[1] = 0x74;
            goto LAB_005dee0d;
          }
          if (bVar1 == 10) {
            pbVar6[0] = 0x5c;
            pbVar6[1] = 0x6e;
            goto LAB_005dee0d;
          }
          if (bVar1 == 0xd) {
            pbVar6[0] = 0x5c;
            pbVar6[1] = 0x72;
            goto LAB_005dee0d;
          }
LAB_005dedef:
          if ((byte)(bVar1 - 0x20) < 0x5f) {
            *pbVar6 = bVar1;
            pbVar6 = pbVar6 + 1;
          }
          else {
            *pbVar6 = 0x5c;
            pbVar6[1] = bVar1 >> 6 | 0x30;
            pbVar6[2] = bVar1 >> 3 & 7 | 0x30;
            pbVar6[3] = bVar1 & 7 | 0x30;
            pbVar6 = pbVar6 + 4;
          }
        }
        else {
          if (bVar1 == 0x22) {
            pbVar6[0] = 0x5c;
            pbVar6[1] = 0x22;
          }
          else if (bVar1 == 0x27) {
            pbVar6[0] = 0x5c;
            pbVar6[1] = 0x27;
          }
          else {
            if (bVar1 != 0x5c) goto LAB_005dedef;
            pbVar6[0] = 0x5c;
            pbVar6[1] = 0x5c;
          }
LAB_005dee0d:
          pbVar6 = pbVar6 + 2;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_50.length_);
    }
  }
  return;
}

Assistant:

void CEscapeAndAppend(StringPiece src, string* dest) {
  size_t escaped_len = CEscapedLength(src);
  if (escaped_len == src.size()) {
    dest->append(src.data(), src.size());
    return;
  }

  size_t cur_dest_len = dest->size();
  dest->resize(cur_dest_len + escaped_len);
  char* append_ptr = &(*dest)[cur_dest_len];

  for (int i = 0; i < src.size(); ++i) {
    unsigned char c = static_cast<unsigned char>(src[i]);
    switch (c) {
      case '\n': *append_ptr++ = '\\'; *append_ptr++ = 'n'; break;
      case '\r': *append_ptr++ = '\\'; *append_ptr++ = 'r'; break;
      case '\t': *append_ptr++ = '\\'; *append_ptr++ = 't'; break;
      case '\"': *append_ptr++ = '\\'; *append_ptr++ = '\"'; break;
      case '\'': *append_ptr++ = '\\'; *append_ptr++ = '\''; break;
      case '\\': *append_ptr++ = '\\'; *append_ptr++ = '\\'; break;
      default:
        if (!isprint(c)) {
          *append_ptr++ = '\\';
          *append_ptr++ = '0' + c / 64;
          *append_ptr++ = '0' + (c % 64) / 8;
          *append_ptr++ = '0' + c % 8;
        } else {
          *append_ptr++ = c;
        }
        break;
    }
  }
}